

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O1

CURLcode cr_in_rewind(Curl_easy *data,Curl_creader *reader)

{
  curl_trc_feat *pcVar1;
  uint uVar2;
  curlioerr cVar3;
  uint *puVar4;
  ulong uVar5;
  char *fmt;
  
  if ((*(byte *)((long)reader->ctx + 0x44) & 4) == 0) {
    return CURLE_OK;
  }
  if ((data->set).seek_func == (curl_seek_callback)0x0) {
    if ((data->set).ioctl_func == (curl_ioctl_callback)0x0) {
      if ((data->state).fread_func == fread) {
        uVar2 = fseek((FILE *)(data->state).in,0,0);
        if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
            ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level)
             ))) && (0 < Curl_trc_feat_read.log_level)) {
          puVar4 = (uint *)__errno_location();
          Curl_trc_read(data,"cr_in, rewind via fseek -> %d(%d)",(ulong)uVar2,(ulong)*puVar4);
        }
        if (uVar2 != 0xffffffff) {
          return CURLE_OK;
        }
      }
      Curl_failf(data,"necessary data rewind was not possible");
      return CURLE_SEND_FAIL_REWIND;
    }
    Curl_set_in_callback(data,true);
    cVar3 = (*(data->set).ioctl_func)(data,1,(data->set).ioctl_client);
    uVar5 = (ulong)cVar3;
    Curl_set_in_callback(data,false);
    if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
        ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level))))
       && (0 < Curl_trc_feat_read.log_level)) {
      Curl_trc_read(data,"cr_in, rewind via set.ioctl_func -> %d",uVar5);
    }
    if (cVar3 == CURLIOE_OK) {
      return CURLE_OK;
    }
    fmt = "ioctl callback returned error %d";
  }
  else {
    Curl_set_in_callback(data,true);
    uVar2 = (*(data->set).seek_func)((data->set).seek_client,0,0);
    uVar5 = (ulong)uVar2;
    Curl_set_in_callback(data,false);
    if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
        ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level))))
       && (0 < Curl_trc_feat_read.log_level)) {
      Curl_trc_read(data,"cr_in, rewind via set.seek_func -> %d",uVar5);
    }
    if (uVar2 == 0) {
      return CURLE_OK;
    }
    fmt = "seek callback returned error %d";
  }
  Curl_failf(data,fmt,uVar5);
  return CURLE_SEND_FAIL_REWIND;
}

Assistant:

static CURLcode cr_in_rewind(struct Curl_easy *data,
                             struct Curl_creader *reader)
{
  struct cr_in_ctx *ctx = reader->ctx;

  /* If we never invoked the callback, there is noting to rewind */
  if(!ctx->has_used_cb)
    return CURLE_OK;

  if(data->set.seek_func) {
    int err;

    Curl_set_in_callback(data, TRUE);
    err = (data->set.seek_func)(data->set.seek_client, 0, SEEK_SET);
    Curl_set_in_callback(data, FALSE);
    CURL_TRC_READ(data, "cr_in, rewind via set.seek_func -> %d", err);
    if(err) {
      failf(data, "seek callback returned error %d", (int)err);
      return CURLE_SEND_FAIL_REWIND;
    }
  }
  else if(data->set.ioctl_func) {
    curlioerr err;

    Curl_set_in_callback(data, TRUE);
    err = (data->set.ioctl_func)(data, CURLIOCMD_RESTARTREAD,
                                 data->set.ioctl_client);
    Curl_set_in_callback(data, FALSE);
    CURL_TRC_READ(data, "cr_in, rewind via set.ioctl_func -> %d", (int)err);
    if(err) {
      failf(data, "ioctl callback returned error %d", (int)err);
      return CURLE_SEND_FAIL_REWIND;
    }
  }
  else {
    /* If no CURLOPT_READFUNCTION is used, we know that we operate on a
       given FILE * stream and we can actually attempt to rewind that
       ourselves with fseek() */
    if(data->state.fread_func == (curl_read_callback)fread) {
      int err = fseek(data->state.in, 0, SEEK_SET);
      CURL_TRC_READ(data, "cr_in, rewind via fseek -> %d(%d)",
                    (int)err, (int)errno);
      if(-1 != err)
        /* successful rewind */
        return CURLE_OK;
    }

    /* no callback set or failure above, makes us fail at once */
    failf(data, "necessary data rewind was not possible");
    return CURLE_SEND_FAIL_REWIND;
  }
  return CURLE_OK;
}